

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O0

void __thiscall UnscentedKalmanFilter::Prediction(UnscentedKalmanFilter *this,double delta_t)

{
  ostream *this_00;
  void *this_01;
  undefined1 local_30 [8];
  MatrixXd Xsig_aug;
  double delta_t_local;
  UnscentedKalmanFilter *this_local;
  
  Xsig_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (DenseIndex)delta_t;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_30,&this->n_aug_,&this->n_sigma_);
  if (this->debug_ != 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Predict ");
    this_01 = (void *)std::ostream::operator<<
                                (this_00,(double)Xsig_aug.
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                 .m_storage.m_cols);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  GenerateAugmentedSigmaPoints(this,&this->x_,&this->P_,(MatrixXd *)local_30);
  SigmaPointPrediction
            (this,(double)Xsig_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols,(MatrixXd *)local_30,&this->Xsig_pred_);
  PredictMeanAndCovariance(this,&this->Xsig_pred_,&this->x_,&this->P_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_30);
  return;
}

Assistant:

void UnscentedKalmanFilter::Prediction(double delta_t) {

    MatrixXd Xsig_aug(n_aug_, n_sigma_);

    if (debug_)
        std::cout << "Predict " << delta_t << std::endl;
 
    GenerateAugmentedSigmaPoints(x_, P_, Xsig_aug);
    SigmaPointPrediction(delta_t, Xsig_aug, Xsig_pred_);
    PredictMeanAndCovariance(Xsig_pred_, x_, P_);
}